

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,
          Maybe<capnp::Schema> *typeScope)

{
  Schema typeScope_00;
  UnfinishedValue local_a8;
  
  compileDefaultDefaultValue(this,type,target);
  if (0xf < type._reader.dataSize) {
    if ((*type._reader.data < 0x13) && ((0x74000U >> (*type._reader.data & 0x1f) & 1) != 0)) {
      local_a8.source._reader.dataSize = source._reader.dataSize;
      local_a8.source._reader.pointerCount = source._reader.pointerCount;
      local_a8.source._reader._38_2_ = source._reader._38_2_;
      local_a8.source._reader.nestingLimit = source._reader.nestingLimit;
      local_a8.source._reader._44_4_ = source._reader._44_4_;
      local_a8.source._reader.data = source._reader.data;
      local_a8.source._reader.pointers = source._reader.pointers;
      local_a8.source._reader.segment = source._reader.segment;
      local_a8.source._reader.capTable = source._reader.capTable;
      local_a8.type._reader._32_8_ = type._reader._32_8_;
      local_a8.type._reader.segment = type._reader.segment;
      local_a8.type._reader.capTable = type._reader.capTable;
      local_a8.type._reader.data = type._reader.data;
      local_a8.type._reader.pointers = type._reader.pointers;
      local_a8.type._reader.nestingLimit = type._reader.nestingLimit;
      local_a8.type._reader._44_4_ = type._reader._44_4_;
      local_a8.typeScope.ptr.isSet = (typeScope->ptr).isSet;
      if (local_a8.typeScope.ptr.isSet == true) {
        local_a8.typeScope.ptr.field_1 = (typeScope->ptr).field_1;
      }
      local_a8.target._builder.dataSize = target._builder.dataSize;
      local_a8.target._builder.pointerCount = target._builder.pointerCount;
      local_a8.target._builder._38_2_ = target._builder._38_2_;
      local_a8.target._builder.data = target._builder.data;
      local_a8.target._builder.pointers = target._builder.pointers;
      local_a8.target._builder.segment = target._builder.segment;
      local_a8.target._builder.capTable = target._builder.capTable;
      kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::
      add<capnp::compiler::NodeTranslator::UnfinishedValue>(&this->unfinishedValues,&local_a8);
      return;
    }
  }
  if ((typeScope->ptr).isSet == true) {
    typeScope_00.raw = (typeScope->ptr).field_1.value.raw;
  }
  else {
    typeScope_00.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  }
  compileValue(this,source,type,typeScope_00,target,true);
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    kj::Maybe<Schema> typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value. (Note that the scope can't possibly matter since primitives are not
      // generic.)
      compileValue(source, type, typeScope.orDefault(Schema()), target, true);
      break;
  }
}